

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O0

void test_1d_dynamic<30ul,30ul>(void)

{
  value_type vVar1;
  int *piVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  int local_160 [4];
  dynamic_dims_array local_150;
  size_type local_148;
  int local_13c [2];
  int i_1;
  int *local_130;
  int *local_128;
  size_type local_120;
  unsigned_long local_118;
  value_type true_idx;
  dimensions<18446744073709551615UL> s;
  int i;
  int *dptr;
  allocator<int> local_e5;
  value_type_conflict1 local_e4;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_c0;
  unsigned_long local_b8;
  size_type local_b0;
  unsigned_long local_a8;
  size_type local_a0;
  bool local_93;
  bool local_92;
  dimensions<0UL> local_91;
  dynamic_dims_array local_90;
  dynamic_dims_array local_88;
  undefined1 local_80 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
  sub_l;
  size_type local_60;
  unsigned_long local_58;
  size_type local_50;
  int local_44;
  size_type local_40;
  bool local_33;
  bool local_32;
  dimensions<0UL> local_31;
  dynamic_dims_array local_30;
  dynamic_dims_array local_28;
  undefined1 local_20 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL>::dimensions<unsigned_long,_nullptr>
            ((dimensions<18446744073709551615UL> *)&local_28,0x1e);
  std::experimental::dimensions<18446744073709551615UL>::dimensions<int,_nullptr>
            ((dimensions<18446744073709551615UL> *)&local_30,1);
  std::experimental::dimensions<0UL>::dimensions(&local_31);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              *)local_20,local_28._M_elems[0],local_30._M_elems[0]);
  local_32 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::is_regular();
  local_33 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_32,&local_33);
  local_40 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                       *)local_20,0);
  local_44 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6f,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_40,&local_44);
  local_50 = std::experimental::dimensions<18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL> *)local_20);
  local_58 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x71,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_50,&local_58);
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                     *)local_20);
  sub_l._16_8_ = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x72,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_60,
             (unsigned_long *)&sub_l.field_0x10);
  std::experimental::dimensions<18446744073709551615UL>::dimensions<unsigned_long,_nullptr>
            ((dimensions<18446744073709551615UL> *)&local_88,1);
  std::experimental::dimensions<18446744073709551615UL>::dimensions<unsigned_long,_nullptr>
            ((dimensions<18446744073709551615UL> *)&local_90,0x1e);
  std::experimental::dimensions<0UL>::dimensions(&local_91);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              *)local_80,local_88._M_elems[0],local_90._M_elems[0]);
  local_92 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::is_regular();
  local_93 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x78,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_92,&local_93);
  local_a0 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                       *)local_80,0);
  local_a8 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7a,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_a0,&local_a8);
  local_b0 = std::experimental::dimensions<18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL> *)local_80);
  local_b8 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7c,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_b0,&local_b8);
  local_c0 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                     *)local_80);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_c0,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar1 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                    ((dimensions<18446744073709551615UL> *)local_20,0);
  local_e4 = 0x2a;
  std::allocator<int>::allocator(&local_e5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,vVar1,&local_e4,&local_e5);
  std::allocator<int>::~allocator(&local_e5);
  piVar2 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_e0);
  s.dynamic_dims_._M_elems[0]._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)s.dynamic_dims_._M_elems[0]._4_4_;
    vVar1 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL> *)local_80,0);
    if (vVar1 <= uVar3) break;
    true_idx = (value_type)
               std::experimental::
               layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
               ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                           *)local_80);
    vVar1 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL> *)&true_idx,0);
    local_118 = vVar1 * (long)s.dynamic_dims_._M_elems[0]._4_4_;
    local_120 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                              *)local_80,s.dynamic_dims_._M_elems[0]._4_4_);
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x89,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_120,&local_118);
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                          *)local_80,s.dynamic_dims_._M_elems[0]._4_4_);
    local_128 = piVar2 + sVar4;
    local_130 = piVar2 + local_118;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x8b,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_128,&local_130);
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                          *)local_80,s.dynamic_dims_._M_elems[0]._4_4_);
    piVar2[sVar4] = 0x11;
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                          *)local_80,s.dynamic_dims_._M_elems[0]._4_4_);
    i_1 = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x8f,"void test_1d_dynamic() [N = 30UL, X = 30UL]",piVar2 + sVar4,&i_1);
    sVar4 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                          *)local_80,s.dynamic_dims_._M_elems[0]._4_4_);
    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)local_e0,sVar4);
    local_13c[1] = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(data.at(sub_l.index(i)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x92,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar5,local_13c + 1);
    s.dynamic_dims_._M_elems[0]._4_4_ = s.dynamic_dims_._M_elems[0]._4_4_ + 1;
  }
  local_13c[0] = 0;
  while( true ) {
    uVar3 = (ulong)local_13c[0];
    vVar1 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL> *)local_20,0);
    if (vVar1 <= uVar3) break;
    local_148 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                              *)local_20,local_13c[0]);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x98,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_148,local_13c);
    uVar3 = (ulong)local_13c[0];
    local_150._M_elems[0] =
         (_Type)std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                            *)local_80);
    vVar1 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL> *)&local_150,0);
    if (uVar3 % vVar1 == 0) {
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                            *)local_20,local_13c[0]);
      local_160[3] = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x9d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",piVar2 + sVar4,local_160 + 3);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                            *)local_20,local_13c[0]);
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_e0,sVar4);
      local_160[2] = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa0,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar5,local_160 + 2);
    }
    else {
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                            *)local_20,local_13c[0]);
      local_160[1] = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa5,"void test_1d_dynamic() [N = 30UL, X = 30UL]",piVar2 + sVar4,local_160 + 1);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
              ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<0UL>_>
                            *)local_20,local_13c[0]);
      pvVar5 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_e0,sVar4);
      local_160[0] = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i)))","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa8,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar5,local_160);
    }
    local_13c[0] = local_13c[0] + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  return;
}

Assistant:

void test_1d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const l{{X}, {1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const sub_l{{X / N}, {N}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    // Initialize all elements to 42.
    std::vector<int> data(l[0], 42);
    int* dptr = data.data();

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i))), 17);
    }

    // Check final structure.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element in the strided sub-box.
        if (0 == (i % sub_l.stepping()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 42);
        }
    }
}